

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::expHelper(Matrix *this,Matrix *m,int num)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  Matrix *m_00;
  double **extraout_RDX;
  double **extraout_RDX_00;
  Matrix *this_00;
  Matrix MVar2;
  Matrix MStack_48;
  Matrix local_38;
  double **ppdVar1;
  
  m_00 = (Matrix *)CONCAT44(in_register_00000014,num);
  this_00 = &MStack_48;
  if (in_ECX == 1) {
    Matrix(this,m_00);
    ppdVar1 = extraout_RDX;
  }
  else if (in_ECX == 0) {
    MVar2 = createIdentity(this,m_00->rows_);
    ppdVar1 = MVar2.p;
  }
  else {
    if ((in_ECX & 1) == 0) {
      operator*((maths *)&MStack_48,m_00,m_00);
      expHelper(this,m,(int)&MStack_48);
    }
    else {
      operator*((maths *)&local_38,m_00,m_00);
      expHelper(&MStack_48,m,(int)&local_38);
      operator*((maths *)this,m_00,&MStack_48);
      ~Matrix(&MStack_48);
      this_00 = &local_38;
    }
    ~Matrix(this_00);
    ppdVar1 = extraout_RDX_00;
  }
  MVar2.p = ppdVar1;
  MVar2._0_8_ = this;
  return MVar2;
}

Assistant:

Matrix Matrix::expHelper(const Matrix& m, int num)
{
    if (num == 0) {
        return createIdentity(m.rows_);
    } else if (num == 1) {
        return m;
    } else if (num % 2 == 0) {  // num is even
        return expHelper(m * m, num/2);
    } else {                    // num is odd
        return m * expHelper(m * m, (num-1)/2);
    }
}